

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_extension.c
# Opt level: O0

int dlep_extension_get_l2_neighbor_key(oonf_layer2_neigh_key *key,dlep_session *session)

{
  int iVar1;
  dlep_session *session_local;
  oonf_layer2_neigh_key *key_local;
  
  memset(key,0,0x23);
  iVar1 = dlep_reader_mac_tlv(key,session,(dlep_parser_value *)0x0);
  if (iVar1 == 0) {
    iVar1 = dlep_reader_lid_tlv(key,session,(dlep_parser_value *)0x0);
    if (iVar1 == 0) {
      if ((uint)key->link_id_length != (session->cfg).lid_length) {
        if (((&log_global_mask)[session->log_source] & 2) != 0) {
          oonf_log(2,session->log_source,"src/generic/dlep/dlep_extension.c",0xd4,0,0,
                   "LID TLV (length=%u) with bad length (should be %u)",key->link_id_length,
                   (session->cfg).lid_length);
        }
        return -1;
      }
    }
    else if (((&log_global_mask)[session->log_source] & 1) != 0) {
      oonf_log(1,session->log_source,"src/generic/dlep/dlep_extension.c",0xd0,0,0,
               "lid tlv not present");
    }
    key_local._4_4_ = 0;
  }
  else {
    if (((&log_global_mask)[session->log_source] & 2) != 0) {
      oonf_log(2,session->log_source,"src/generic/dlep/dlep_extension.c",0xcb,0,0,"mac tlv missing")
      ;
    }
    key_local._4_4_ = -1;
  }
  return key_local._4_4_;
}

Assistant:

int
dlep_extension_get_l2_neighbor_key(struct oonf_layer2_neigh_key *key, struct dlep_session *session) {
  memset(key, 0, sizeof(*key));
  if (dlep_reader_mac_tlv(key, session, NULL)) {
    OONF_INFO(session->log_source, "mac tlv missing");
    return -1;
  }

  if (dlep_reader_lid_tlv(key, session, NULL)) {
    OONF_DEBUG(session->log_source, "lid tlv not present");
  }
  else if (key->link_id_length != session->cfg.lid_length) {
    OONF_INFO(session->log_source, "LID TLV (length=%u) with bad length (should be %u)",
              key->link_id_length, session->cfg.lid_length);
    return -1;
  }
  return 0;
}